

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

double duckdb::BinaryLambdaWrapper::
       Operation<duckdb::JaccardFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,double>
                 (anon_class_8_1_6971b95b fun,string_t left,string_t right,ValidityMask *mask,
                 idx_t idx)

{
  size_t sVar1;
  size_t sVar2;
  InvalidInputException *this;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  anon_union_16_2_67f50693_for_value local_a8;
  anon_union_16_2_67f50693_for_value local_98;
  bitset<256UL> local_88;
  bitset<256UL> __result;
  _Base_bitset<4UL> local_48;
  
  local_a8._0_8_ = left.value._8_8_;
  local_98.pointer.ptr = (char *)left.value._0_8_;
  local_a8.pointer.ptr = (char *)right.value._0_8_;
  local_98._0_8_ = fun.result;
  if (((int)fun.result != 0) &&
     (((undefined1  [16])left.value & (undefined1  [16])0xffffffff) != (undefined1  [16])0x0)) {
    local_48._M_w[2] = 0;
    local_48._M_w[3] = 0;
    local_48._M_w[0] = 0;
    local_48._M_w[1] = 0;
    GetSet(&local_88,(string_t *)&local_98.pointer);
    GetSet((bitset<256UL> *)&local_48,(string_t *)&local_a8.pointer);
    __result.super__Base_bitset<4UL>._M_w[2] = local_88.super__Base_bitset<4UL>._M_w[2];
    __result.super__Base_bitset<4UL>._M_w[3] = local_88.super__Base_bitset<4UL>._M_w[3];
    __result.super__Base_bitset<4UL>._M_w[0] = local_88.super__Base_bitset<4UL>._M_w[0];
    __result.super__Base_bitset<4UL>._M_w[1] = local_88.super__Base_bitset<4UL>._M_w[1];
    std::_Base_bitset<4UL>::_M_do_and(&__result.super__Base_bitset<4UL>,&local_48);
    sVar1 = std::_Base_bitset<4UL>::_M_do_count(&__result.super__Base_bitset<4UL>);
    __result.super__Base_bitset<4UL>._M_w[2] = local_88.super__Base_bitset<4UL>._M_w[2];
    __result.super__Base_bitset<4UL>._M_w[3] = local_88.super__Base_bitset<4UL>._M_w[3];
    __result.super__Base_bitset<4UL>._M_w[0] = local_88.super__Base_bitset<4UL>._M_w[0];
    __result.super__Base_bitset<4UL>._M_w[1] = local_88.super__Base_bitset<4UL>._M_w[1];
    std::_Base_bitset<4UL>::_M_do_or(&__result.super__Base_bitset<4UL>,&local_48);
    sVar2 = std::_Base_bitset<4UL>::_M_do_count(&__result.super__Base_bitset<4UL>);
    auVar3._8_4_ = (int)(sVar1 >> 0x20);
    auVar3._0_8_ = sVar1;
    auVar3._12_4_ = 0x45300000;
    auVar4._8_4_ = (int)(sVar2 >> 0x20);
    auVar4._0_8_ = sVar2;
    auVar4._12_4_ = 0x45300000;
    return ((auVar3._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) /
           ((auVar4._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0));
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)&local_88,"Jaccard Function: An argument too short!",(allocator *)&local_48);
  duckdb::InvalidInputException::InvalidInputException(this,(string *)&local_88);
  __cxa_throw(this,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static inline RESULT_TYPE Operation(FUNC fun, LEFT_TYPE left, RIGHT_TYPE right, ValidityMask &mask, idx_t idx) {
		return fun(left, right);
	}